

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O2

QString * __thiscall
QWidgetLineControl::inputMask(QString *__return_storage_ptr__,QWidgetLineControl *this)

{
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (*(long *)(this + 0xe8) != 0) {
    QString::operator=(__return_storage_ptr__,(QString *)(this + 200));
    if (*(short *)(this + 0xe0) != 0x20) {
      QString::append((QChar)(char16_t)__return_storage_ptr__);
      QString::append((QChar)(char16_t)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString inputMask() const
    {
        QString mask;
        if (m_maskData) {
            mask = m_inputMask;
            if (m_blank != u' ') {
                mask += u';';
                mask += m_blank;
            }
        }
        return mask;
    }